

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O2

bool __thiscall ON_AerialPhotoCameraPosition::OrientationIsSet(ON_AerialPhotoCameraPosition *this)

{
  bool bVar1;
  
  if ((this->m_status & 2) != 0) {
    bVar1 = ON_3dVector::IsValid(&this->m_orientation_angles_radians);
    if (bVar1) {
      bVar1 = ON_3dVector::IsValid(&this->m_orientation_angles_degrees);
      if (bVar1) {
        bVar1 = ON_3dVector::IsValid(&this->m_orientation_right);
        if (bVar1) {
          bVar1 = ON_3dVector::IsValid(&this->m_orientation_up);
          if (bVar1) {
            bVar1 = ON_3dVector::IsValid(&this->m_orientation_direction);
            if (bVar1) {
              bVar1 = ON_Xform::IsValid(&this->m_orientation_rotation);
              return bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_AerialPhotoCameraPosition::OrientationIsSet() const
{
  return ( 0 != (m_status & 2) 
           && m_orientation_angles_radians.IsValid() 
           && m_orientation_angles_degrees.IsValid()
           && m_orientation_right.IsValid()
           && m_orientation_up.IsValid()
           && m_orientation_direction.IsValid()
           && m_orientation_rotation.IsValid()
         );
}